

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O2

void __thiscall QAbstractTestLogger::filterUnprintable(QAbstractTestLogger *this,char *str)

{
  byte bVar1;
  
  for (; bVar1 = *str, bVar1 != 0; str = (char *)((byte *)str + 1)) {
    if ((bVar1 == 0x7f) || (bVar1 < 0x20 && (byte)(bVar1 - 0xb) < 0xfe)) {
      *str = 0x3f;
    }
  }
  return;
}

Assistant:

void QAbstractTestLogger::filterUnprintable(char *str) const
{
    unsigned char *idx = reinterpret_cast<unsigned char *>(str);
    while (*idx) {
        if (((*idx < 0x20 && *idx != '\n' && *idx != '\t') || *idx == 0x7f))
            *idx = '?';
        ++idx;
    }
}